

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint ON_SubDSectorType::SectorEdgeCountFromFaceCount
               (ON_SubDVertexTag vertex_tag,uint sector_face_count)

{
  undefined4 local_1c;
  uint sector_edge_count;
  uint sector_face_count_local;
  ON_SubDVertexTag vertex_tag_local;
  
  if ((sector_face_count == 0) || (0xfff0 < sector_face_count)) {
    ON_SubDIncrementErrorCount();
    sector_face_count_local = 0;
  }
  else {
    if ((vertex_tag == Crease) || (local_1c = sector_face_count, vertex_tag == Corner)) {
      local_1c = sector_face_count + 1;
    }
    sector_face_count_local = local_1c;
  }
  return sector_face_count_local;
}

Assistant:

unsigned int ON_SubDSectorType::SectorEdgeCountFromFaceCount(
  ON_SubDVertexTag vertex_tag,
  unsigned int sector_face_count
  )
{
  if (sector_face_count > 0 && sector_face_count <= ON_SubDVertex::MaximumFaceCount)
  {
    unsigned int sector_edge_count
      = (ON_SubDVertexTag::Crease == vertex_tag || ON_SubDVertexTag::Corner == vertex_tag)
      ? sector_face_count+1
      : sector_face_count;
    return sector_edge_count;
  }
  return ON_SUBD_RETURN_ERROR(0);
}